

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O2

void __thiscall ExtraData::parseFullScreen(ExtraData *this)

{
  uint uVar1;
  ostream *poVar2;
  char *pcVar3;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_20;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_20,
             &(this->CONSOLE_PROPS).FullScreen);
  uVar1 = Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_20);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_20);
  pcVar3 = "Full-screen mode is on.";
  if (uVar1 == 0) {
    pcVar3 = "Full-screen mode is off.";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void ExtraData::parseFullScreen() {
    if (Utils::lenFourBytes(CONSOLE_PROPS.FullScreen) > 0x00000000)
        cout << "Full-screen mode is on." << endl;
    else
        cout << "Full-screen mode is off." << endl;
}